

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void * __thiscall
google::protobuf::Reflection::GetRawRepeatedField
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpptype,int ctype,
          Descriptor *desc)

{
  byte bVar1;
  bool bVar2;
  uint32_t uVar3;
  Descriptor *pDVar4;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *pRVar5;
  void *pvVar6;
  char *pcVar7;
  Nonnull<const_char_*> failure_msg;
  char *method;
  string_view str;
  LogMessage local_30;
  
  bVar1 = field->field_0x1;
  if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
    GetRawRepeatedField();
LAB_002a0fd3:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xae2,"IsMatchingCType(field, ctype)");
    str._M_str = "subtype mismatch";
    str._M_len = 0x10;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_30,str);
LAB_002a1082:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  if ((bVar1 & 0x20) == 0) {
    pDVar4 = this->descriptor_;
    method = "\"GetRawRepeatedField\"";
    pcVar7 = "Field is singular; the method requires a repeated field.";
LAB_002a1069:
    anon_unknown_6::ReportReflectionUsageError(pDVar4,field,method,pcVar7);
  }
  pDVar4 = this->descriptor_;
  if (field->containing_type_ != pDVar4) {
    method = "GetRawRepeatedField";
    pcVar7 = "Field does not match message type.";
    goto LAB_002a1069;
  }
  if ((*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != cpptype) &&
     ((cpptype != CPPTYPE_INT32 ||
      (*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != CPPTYPE_ENUM)))
     ) {
    anon_unknown_6::ReportReflectionUsageTypeError(pDVar4,field,"GetRawRepeatedField",cpptype);
  }
  if (-1 < ctype) {
    bVar2 = internal::IsMatchingCType(field,ctype);
    if (!bVar2) goto LAB_002a0fd3;
  }
  if (desc != (Descriptor *)0x0) {
    pDVar4 = FieldDescriptor::message_type(field);
    if (pDVar4 != desc) {
      failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                              (pDVar4,desc,"field->message_type() == desc");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0xae4,failure_msg);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (&local_30,(char (*) [22])"wrong submessage type");
      goto LAB_002a1082;
    }
  }
  if ((field->field_0x1 & 8) != 0) {
    uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    pvVar6 = internal::ExtensionSet::GetRawRepeatedField
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                        field->number_,internal::kZeroBuffer);
    return pvVar6;
  }
  if (field->type_ == '\v') {
    bVar2 = FieldDescriptor::is_map_message_type(field);
    if (bVar2) {
      this_00 = GetRawNonOneof<google::protobuf::internal::MapFieldBase>(this,message,field);
      pRVar5 = internal::MapFieldBase::GetRepeatedField(this_00);
      return pRVar5;
    }
  }
  pcVar7 = GetRawNonOneof<char>(this,message,field);
  return pcVar7;
}

Assistant:

const void* Reflection::GetRawRepeatedField(const Message& message,
                                            const FieldDescriptor* field,
                                            FieldDescriptor::CppType cpptype,
                                            int ctype,
                                            const Descriptor* desc) const {
  USAGE_CHECK_REPEATED("GetRawRepeatedField");
  USAGE_CHECK_MESSAGE_TYPE(GetRawRepeatedField);
  if (field->cpp_type() != cpptype &&
      (field->cpp_type() != FieldDescriptor::CPPTYPE_ENUM ||
       cpptype != FieldDescriptor::CPPTYPE_INT32))
    ReportReflectionUsageTypeError(descriptor_, field, "GetRawRepeatedField",
                                   cpptype);
  if (ctype >= 0)
    ABSL_CHECK(IsMatchingCType(field, ctype)) << "subtype mismatch";
  if (desc != nullptr)
    ABSL_CHECK_EQ(field->message_type(), desc) << "wrong submessage type";
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRawRepeatedField(
        field->number(), internal::DefaultRawPtr());
  } else {
    // Trigger transform for MapField
    if (IsMapFieldInApi(field)) {
      return &(GetRawNonOneof<MapFieldBase>(message, field).GetRepeatedField());
    }
    return &GetRawNonOneof<char>(message, field);
  }
}